

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O1

void mxx::
     redo_arbit_decomposition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t new_local_size,comm *comm)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int *msgs;
  unsigned_long uVar4;
  long *plVar5;
  uint uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  size_t local_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_local_sizes;
  allocator_type local_b9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  size_t local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  int *local_80;
  size_t local_78;
  custom_op<unsigned_long> local_70;
  
  local_a0 = (long)end._M_current - (long)begin._M_current >> 2;
  local_78 = new_local_size;
  if (comm->m_size == 1) {
    if (local_a0 != new_local_size) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_70);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_70._vptr_custom_op,
             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
             ,0x1a2,"redo_arbit_decomposition","local_size == new_local_size");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    if (end._M_current != begin._M_current) {
      memmove(out._M_current,begin._M_current,(long)end._M_current - (long)begin._M_current);
    }
  }
  else {
    local_80 = begin._M_current;
    custom_op<unsigned_long>::custom_op<std::plus<unsigned_long>>(&local_70,1);
    MPI_Allreduce(&local_a0,&local_b8,1,local_70.m_type_copy,local_70.m_op);
    uVar10 = CONCAT44(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)local_b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    custom_op<unsigned_long>::~custom_op(&local_70);
    uVar4 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_a0,comm,1);
    uVar7 = 0;
    if (comm->m_rank == 0) {
      uVar4 = uVar7;
    }
    allgather<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_70,&local_78,1,comm);
    msgs = local_80;
    plVar5 = (long *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
    if (plVar5 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
      uVar7 = 0;
      do {
        uVar7 = uVar7 + *plVar5;
        plVar5 = plVar5 + 1;
      } while (plVar5 != (long *)local_70.m_user_func.super__Function_base._M_functor._M_unused.
                                 _0_8_);
    }
    if (uVar7 != uVar10) {
      MPI_Comm_rank(&ompi_mpi_comm_world,&local_b8);
      printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
             (ulong)(uint)local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
             ,0x1c0,"redo_arbit_decomposition");
      fflush(_stdout);
      MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
    }
    local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_b8,(long)comm->m_size,(value_type_conflict2 *)&local_98,&local_b9);
    iVar1 = comm->m_size;
    if (iVar1 < 2) {
      uVar6 = 0;
      uVar10 = 0;
    }
    else {
      uVar6 = iVar1 - 1;
      uVar9 = 0;
      uVar7 = 0;
      do {
        uVar10 = *(long *)(CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op) +
                          uVar9 * 8) + uVar7;
        if (uVar4 < uVar10) {
          uVar6 = (uint)uVar9;
          uVar10 = uVar7;
          break;
        }
        uVar9 = uVar9 + 1;
        uVar7 = uVar10;
      } while (uVar6 != uVar9);
    }
    if ((int)uVar6 < iVar1 && local_a0 != 0) {
      lVar11 = 0;
      sVar8 = local_a0;
      do {
        uVar10 = uVar10 + *(long *)(CONCAT44(local_70._vptr_custom_op._4_4_,
                                             (uint)local_70._vptr_custom_op) + (ulong)uVar6 * 8 +
                                   lVar11 * 8);
        uVar7 = uVar10 - uVar4;
        if (sVar8 < uVar10 - uVar4) {
          uVar7 = sVar8;
        }
        *(ulong *)((ulong)uVar6 * 8 +
                   CONCAT44(local_b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_b8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + lVar11 * 8) = uVar7;
        sVar8 = sVar8 - uVar7;
        if (sVar8 == 0) break;
        uVar4 = uVar4 + uVar7;
        iVar2 = (int)lVar11;
        lVar11 = lVar11 + 1;
      } while ((int)(uVar6 + 1 + iVar2) < iVar1);
    }
    all2all<unsigned_long>(&local_98,&local_b8,comm);
    all2allv<int>(msgs,&local_b8,out._M_current,&local_98,comm);
    if (local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pvVar3 = (void *)CONCAT44(local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (uint)local_b8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_b8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3
                     );
    }
    pvVar3 = (void *)CONCAT44(local_70._vptr_custom_op._4_4_,(uint)local_70._vptr_custom_op);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,local_70.m_user_func.super__Function_base._M_functor._8_8_ -
                             (long)pvVar3);
    }
  }
  return;
}

Assistant:

void redo_arbit_decomposition(_InIterator begin, _InIterator end, _OutIterator out, size_t new_local_size, const mxx::comm& comm) {
    // get local size
    size_t local_size = std::distance(begin, end);

    // if single process, simply copy to output
    if (comm.size() == 1) {
        MXX_ASSERT(local_size == new_local_size);
        std::copy(begin, end, out);
        return;
    }

    // get prefix sum of size and total size
#if !defined(NDEBUG) || MEASURE_LOAD_BALANCE != 0
    size_t total_size = mxx::allreduce(local_size, comm);
#endif
    size_t prefix = mxx::exscan(local_size, comm);
    if (comm.rank() == 0)
        prefix = 0;

#if MEASURE_LOAD_BALANCE
    size_t min = mxx::reduce(local_size, 0, mxx::min<size_t>(), comm);
    size_t max = mxx::reduce(local_size, 0, mxx::max<size_t>(), comm);
    size_t min_new = mxx::reduce(new_local_size, 0, mxx::min<size_t>(), comm);
    size_t max_new = mxx::reduce(new_local_size, 0, mxx::max<size_t>(), comm);
    if(comm.rank() == 0)
      std::cerr << " Decomposition: old [" << min << "," << max << "], new= [" << min_new << "," << max_new << "], for n=" << total_size << " fair decomposition: " << total_size / comm.size() << std::endl;

    std::vector<size_t> toReceive = mxx::gather(new_local_size, 0, comm);
    if(comm.rank() == 0)
      std::cerr << toReceive << std::endl;
#endif

    // get the new local sizes from all processors
    // NOTE: this all-gather is what makes the arbitrary decomposition worse
    // in terms of complexity than when assuming a block decomposition
    std::vector<size_t> new_local_sizes = mxx::allgather(new_local_size, comm);
    MXX_ASSERT(std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), static_cast<size_t>(0)) == total_size);

    // calculate where to send elements
    std::vector<size_t> send_counts(comm.size(), 0);
    int first_p;
    size_t new_prefix = 0;
    for (first_p = 0; first_p < comm.size()-1; ++first_p)
    {
        // find processor for which the prefix sum exceeds mine
        // i have to send to the previous
        if (new_prefix + new_local_sizes[first_p] > prefix)
            break;
        new_prefix += new_local_sizes[first_p];
    }

    //= block_partition_target_processor(total_size, p, prefix);
    size_t left_to_send = local_size;
    for (; left_to_send > 0 && first_p < comm.size(); ++first_p)
    {
        // make the `new` prefix inclusive (is an exlcusive prefix prior)
        new_prefix += new_local_sizes[first_p];
        // send as many elements to the current processor as it needs to fill
        // up, but at most as many as I have left
        size_t nsend = std::min<size_t>(new_prefix - prefix, left_to_send);
        send_counts[first_p] = nsend;
        // update the number of elements i have left (`left_to_send`) and
        // at which global index they start `prefix`
        left_to_send -= nsend;
        prefix += nsend;
    }

    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    // TODO: all2allv for iterators
    mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
}